

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::Append(PosixWritableFile *this,Slice *data)

{
  size_t sVar1;
  int *piVar2;
  undefined8 *in_RDX;
  
  sVar1 = fwrite_unlocked((void *)*in_RDX,1,in_RDX[1],(FILE *)data[2].size_);
  if (sVar1 == in_RDX[1]) {
    (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
  }
  else {
    piVar2 = __errno_location();
    IOError((anon_unknown_1 *)this,(string *)&data->size_,*piVar2);
  }
  return (Status)(char *)this;
}

Assistant:

virtual Status Append(const Slice &data) {
                size_t r = fwrite_unlocked(data.data(), 1, data.size(), file_);
                if (r != data.size()) {
                    return IOError(filename_, errno);
                }
                return Status::OK();
            }